

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDScanner::scanEntityDecl(DTDScanner *this)

{
  ReaderMgr *this_00;
  NameIdPool<xercesc_4_0::DTDEntityDecl> *this_01;
  DTDGrammar *this_02;
  XMLScanner *this_03;
  bool bVar1;
  bool bVar2;
  XMLCh toCheck;
  int iVar3;
  XMLReader *this_04;
  XMLBuffer *toFill;
  XMLCh *pXVar4;
  DTDEntityDecl *pDVar5;
  bool hasNoDTD;
  DTDEntityDecl *pDStack_40;
  bool isIgnored;
  DTDEntityDecl *entityDecl;
  undefined1 local_28 [8];
  XMLBufBid bbName;
  bool isPEDecl;
  DTDScanner *this_local;
  
  bVar1 = ReaderMgr::lookingAtSpace(this->fReaderMgr);
  if (bVar1) {
    ReaderMgr::skipPastSpaces(this->fReaderMgr);
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bbName.fMgr._7_1_ = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
  if ((bool)bbName.fMgr._7_1_) {
    this_04 = ReaderMgr::getCurrentReader(this->fReaderMgr);
    toCheck = ReaderMgr::peekNextChar(this->fReaderMgr);
    bVar1 = XMLReader::isWhitespace(this_04,toCheck);
    if (bVar1) {
      bVar1 = checkForPERef(this,false,true);
      if (!bVar1) {
        XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
      }
    }
    else {
      bbName.fMgr._7_1_ = 0;
      do {
        bVar1 = expandPERef(this,false,false,true,false);
        if (!bVar1) {
          XMLScanner::emitError(this->fScanner,ExpectedEntityRefName);
        }
        bVar1 = ReaderMgr::skippedSpace(this->fReaderMgr);
        if (bVar1) {
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
        }
        bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
      } while (bVar1);
    }
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_28,this->fBufMgr);
  this_00 = this->fReaderMgr;
  toFill = XMLBufBid::getBuffer((XMLBufBid *)local_28);
  bVar1 = ReaderMgr::getName(this_00,toFill);
  if (bVar1) {
    bVar1 = XMLScanner::getDoNamespaces(this->fScanner);
    if (bVar1) {
      pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      iVar3 = XMLString::indexOf(pXVar4,L':');
      if (iVar3 != -1) {
        XMLScanner::emitError(this->fScanner,ColonNotLegalWithNS);
      }
    }
    if ((bbName.fMgr._7_1_ & 1) == 0) {
      this_02 = this->fDTDGrammar;
      pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      pDStack_40 = DTDGrammar::getEntityDecl(this_02,pXVar4);
    }
    else {
      this_01 = this->fPEntityDeclPool;
      pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      pDStack_40 = NameIdPool<xercesc_4_0::DTDEntityDecl>::getByKey(this_01,pXVar4);
    }
    if (pDStack_40 == (DTDEntityDecl *)0x0) {
      pDStack_40 = (DTDEntityDecl *)XMemory::operator_new(0x60,this->fGrammarPoolMemoryManager);
      pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      DTDEntityDecl::DTDEntityDecl(pDStack_40,pXVar4,false,this->fGrammarPoolMemoryManager);
      DTDEntityDecl::setDeclaredInIntSubset(pDStack_40,(bool)(this->fInternalSubset & 1));
      if ((bbName.fMgr._7_1_ & 1) == 0) {
        DTDGrammar::putEntityDecl(this->fDTDGrammar,pDStack_40);
      }
      else {
        NameIdPool<xercesc_4_0::DTDEntityDecl>::put(this->fPEntityDeclPool,pDStack_40);
      }
    }
    else {
      if (this->fDumEntityDecl == (DTDEntityDecl *)0x0) {
        pDVar5 = (DTDEntityDecl *)XMemory::operator_new(0x60,this->fMemoryManager);
        DTDEntityDecl::DTDEntityDecl(pDVar5,this->fMemoryManager);
        this->fDumEntityDecl = pDVar5;
      }
      pDVar5 = this->fDumEntityDecl;
      pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      XMLEntityDecl::setName(&pDVar5->super_XMLEntityDecl,pXVar4);
      pDStack_40 = this->fDumEntityDecl;
    }
    pDVar5 = this->fDumEntityDecl;
    DTDEntityDecl::setIsParameter(pDStack_40,(bool)(bbName.fMgr._7_1_ & 1));
    bVar1 = checkForPERef(this,false,true);
    if (!bVar1) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
    bVar1 = XMLScanner::getHasNoDTD(this->fScanner);
    if ((bVar1) && ((bbName.fMgr._7_1_ & 1) != 0)) {
      XMLScanner::setHasNoDTD(this->fScanner,false);
    }
    bVar2 = scanEntityDef(this,pDStack_40,(bool)(bbName.fMgr._7_1_ & 1));
    if (bVar2) {
      if (bVar1) {
        XMLScanner::setHasNoDTD(this->fScanner,true);
      }
      checkForPERef(this,false,true);
      bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
      if (!bVar1) {
        this_03 = this->fScanner;
        pXVar4 = XMLEntityDecl::getName(&pDStack_40->super_XMLEntityDecl);
        XMLScanner::emitError
                  (this_03,UnterminatedEntityDecl,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
      if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
        (*this->fDocTypeHandler->_vptr_DocTypeHandler[0xb])
                  (this->fDocTypeHandler,pDStack_40,(ulong)(bbName.fMgr._7_1_ & 1),
                   (ulong)(pDStack_40 == pDVar5));
      }
    }
    else {
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      XMLScanner::setHasNoDTD(this->fScanner,true);
      XMLScanner::emitError(this->fScanner,ExpectedEntityValue);
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedPEName);
    ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_28);
  return;
}

Assistant:

void DTDScanner::scanEntityDecl()
{
    //
    //  Space is required here, but we cannot check for a PE Ref since
    //  there could be a legal (no-ref) percent sign here. Since any
    //  entity that ended here would be illegal, we just skip spaces
    //  and then check for a percent.
    //
    if (!fReaderMgr->lookingAtSpace())
        fScanner->emitError(XMLErrs::ExpectedWhitespace);
    else
        fReaderMgr->skipPastSpaces();
    bool isPEDecl = fReaderMgr->skippedChar(chPercent);

    //
    //  If a PE decl, then check if it is followed by a space; if it is so, 
    //  eat the percent and check for spaces or a PE ref on the other side of it. 
    //  Otherwise, it has to be an entity reference for a general entity.
    //
    if (isPEDecl)
    {
        if(!fReaderMgr->getCurrentReader()->isWhitespace(fReaderMgr->peekNextChar()))
        {
            isPEDecl=false;
            while (true)
            {
               if (!expandPERef(false, false, true, false))
                  fScanner->emitError(XMLErrs::ExpectedEntityRefName);
               // And skip any more spaces in the expanded value
               if (fReaderMgr->skippedSpace())
                  fReaderMgr->skipPastSpaces();
               if (!fReaderMgr->skippedChar(chPercent))
                  break;
            }
        }
        else if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
    }

    //
    //  Now lets get a name, which should be the name of the entity. We
    //  have to get a buffer for this.
    //
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedPEName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // If namespaces are enabled, then no colons allowed
    if (fScanner->getDoNamespaces())
    {
        if (XMLString::indexOf(bbName.getRawBuffer(), chColon) != -1)
            fScanner->emitError(XMLErrs::ColonNotLegalWithNS);
    }

    //
    //  See if this entity already exists. If so, then the existing one
    //  takes precendence. So we use the local dummy decl to parse into
    //  and just ignore the results.
    //
    DTDEntityDecl* entityDecl;
    if (isPEDecl)
        entityDecl = fPEntityDeclPool->getByKey(bbName.getRawBuffer());
    else
        entityDecl = fDTDGrammar->getEntityDecl(bbName.getRawBuffer());

    if (entityDecl)
    {
        if (!fDumEntityDecl)
            fDumEntityDecl = new (fMemoryManager) DTDEntityDecl(fMemoryManager);
        fDumEntityDecl->setName(bbName.getRawBuffer());
        entityDecl = fDumEntityDecl;
    }
     else
    {
        // Its not in existence already, then create an entity decl for it
        entityDecl = new (fGrammarPoolMemoryManager) DTDEntityDecl(bbName.getRawBuffer(), false, fGrammarPoolMemoryManager);

        //
        //  Set the declaration location. The parameter indicates whether its
        //  declared in the content/internal subset, so we know whether or not
        //  its in the external subset.
        //
        entityDecl->setDeclaredInIntSubset(fInternalSubset);

        // Add it to the appropriate entity decl pool
        if (isPEDecl)
            fPEntityDeclPool->put(entityDecl);
         else
            fDTDGrammar->putEntityDecl(entityDecl);
    }

    // Set a flag that indicates whether we are ignoring this one
    const bool isIgnored = (entityDecl == fDumEntityDecl);

    // Set the PE flag on it
    entityDecl->setIsParameter(isPEDecl);

    //
    //  Space is legal (required actually) here so check for a PE ref. If
    //  we don't get our whitespace, then issue an error, but try to keep
    //  going.
    //
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // save the hasNoDTD status for Entity Constraint Checking
    bool hasNoDTD = fScanner->getHasNoDTD();
    if (hasNoDTD && isPEDecl)
        fScanner->setHasNoDTD(false);

    // According to the type call the value scanning method
    if (!scanEntityDef(*entityDecl, isPEDecl))
    {
        fReaderMgr->skipPastChar(chCloseAngle);
        fScanner->setHasNoDTD(true);
        fScanner->emitError(XMLErrs::ExpectedEntityValue);
        return;
    }
    if (hasNoDTD)
        fScanner->setHasNoDTD(true);

    // Space is legal (but not required) here so check for a PE ref
    checkForPERef(false, true);

    // And then we have to have the closing angle bracket
    if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedEntityDecl, entityDecl->getName());
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a doc type handler, then call it. But only call it for
    //  ignored elements if advanced callbacks are enabled.
    //
    if (fDocTypeHandler)
        fDocTypeHandler->entityDecl(*entityDecl, isPEDecl, isIgnored);
}